

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v1.cpp
# Opt level: O2

void __thiscall
LASreadItemCompressed_RGB12_v1::LASreadItemCompressed_RGB12_v1
          (LASreadItemCompressed_RGB12_v1 *this,ArithmeticDecoder *dec)

{
  ArithmeticModel *pAVar1;
  IntegerCompressor *this_00;
  U8 *pUVar2;
  
  (this->super_LASreadItemCompressed).super_LASreadItem._vptr_LASreadItem =
       (_func_int **)&PTR_read_0015f7e8;
  if (dec != (ArithmeticDecoder *)0x0) {
    this->dec = dec;
    pAVar1 = ArithmeticDecoder::createSymbolModel(dec,0x40);
    this->m_byte_used = pAVar1;
    this_00 = (IntegerCompressor *)operator_new(0x48);
    IntegerCompressor::IntegerCompressor(this_00,dec,8,6,8,0);
    this->ic_rgb = this_00;
    pUVar2 = (U8 *)operator_new__(6);
    this->last_item = pUVar2;
    return;
  }
  __assert_fail("dec",
                "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/lasreaditemcompressed_v1.cpp"
                ,0x17e,
                "LASreadItemCompressed_RGB12_v1::LASreadItemCompressed_RGB12_v1(ArithmeticDecoder *)"
               );
}

Assistant:

LASreadItemCompressed_RGB12_v1::LASreadItemCompressed_RGB12_v1(ArithmeticDecoder* dec)
{
  /* set decoder */
  assert(dec);
  this->dec = dec;

  /* create models and integer compressors */
  m_byte_used = dec->createSymbolModel(64);
  ic_rgb = new IntegerCompressor(dec, 8, 6);

  /* create last item */
  last_item = new U8[6];
}